

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O3

void ValueType::RunUnitTests(void)

{
  code *pcVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar2;
  ValueType VVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  ValueType VVar7;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar8;
  anon_union_2_4_ea848c7b_for_ValueType_13 other;
  ValueType VVar9;
  undefined4 *puVar10;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  char *message;
  TypeId typeId;
  char *error;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t i;
  size_t i_00;
  size_t i_01;
  size_t i_02;
  size_t i_03;
  size_t i_04;
  size_t extraout_RDX_01;
  size_t i_05;
  size_t extraout_RDX_02;
  size_t sVar11;
  size_t i_06;
  size_t i_07;
  size_t i_08;
  size_t i_09;
  bool bVar12;
  Bits BVar13;
  Bits bits;
  uint lineNumber;
  short sVar14;
  ObjectType objectType;
  bool noMissingValues;
  anon_class_1_0_00000001 *this;
  size_t j;
  long lVar15;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5a;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_58;
  undefined6 uStack_56;
  ValueType TaggedInt;
  ValueType m;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  ValueType IntAndLikelyUntagged;
  ValueType m_1;
  
  local_5a.bits = Int|CanBeTaggedValue;
  ValueType((ValueType *)&stack0xffffffffffffffa8,IntCanBeUntagged|Int|CanBeTaggedValue);
  uVar4 = _aStack_58;
  VVar9.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  ValueType((ValueType *)&stack0xffffffffffffffa8,
            IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue);
  uVar5 = _aStack_58;
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  local_34 = VVar3.field_0;
  if (VVar9.field_0 == (Int|CanBeTaggedValue)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    error = "(!IntAndLikelyTagged.IsTaggedInt())";
    message = "!IntAndLikelyTagged.IsTaggedInt()";
    lineNumber = 0x6df;
LAB_00b0dcca:
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,lineNumber,error,message);
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  else {
    if (((ushort)VVar9.field_0 & 0xffbf) != 0x28) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x6e0,"(IntAndLikelyTagged.IsIntAndLikelyTagged())",
                         "IntAndLikelyTagged.IsIntAndLikelyTagged()");
      if (!bVar6) goto LAB_00b10cd8;
      *puVar10 = 0;
    }
    if (((ushort)VVar9.field_0 & 0xfdbe) != 0x28) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x6e1,"(IntAndLikelyTagged.IsLikelyTaggedInt())",
                         "IntAndLikelyTagged.IsLikelyTaggedInt()");
      if (!bVar6) goto LAB_00b10cd8;
      *puVar10 = 0;
    }
    if (((ushort)VVar9.field_0 & 0xfdf6) == 0xe0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x6e2,"(!IntAndLikelyTagged.IsLikelyUntaggedInt())",
                         "!IntAndLikelyTagged.IsLikelyUntaggedInt()");
      if (!bVar6) goto LAB_00b10cd8;
      *puVar10 = 0;
    }
    if (((ushort)VVar9.field_0 & 0xff37) != 0x20) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x6e3,"(IntAndLikelyTagged.IsInt())","IntAndLikelyTagged.IsInt()");
      if (!bVar6) goto LAB_00b10cd8;
      *puVar10 = 0;
    }
    if (((ushort)VVar9.field_0 & 0xfd36) != 0x20) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x6e4,"(IntAndLikelyTagged.IsLikelyInt())",
                         "IntAndLikelyTagged.IsLikelyInt()");
      if (!bVar6) goto LAB_00b10cd8;
      *puVar10 = 0;
    }
    if (((ushort)VVar9.field_0 & 0xfd14) == 0x100) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      error = "(!IntAndLikelyTagged.IsLikelyFloat())";
      message = "!IntAndLikelyTagged.IsLikelyFloat()";
      lineNumber = 0x6e5;
      goto LAB_00b0dcca;
    }
  }
  if ((uVar4 & 800) == 0 || (uVar4 & 0xfc17) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6e6,"(IntAndLikelyTagged.IsNumber())","IntAndLikelyTagged.IsNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if ((uVar4 & 800) == 0 || (uVar4 & 0xfc14) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6e7,"(IntAndLikelyTagged.IsLikelyNumber())",
                       "IntAndLikelyTagged.IsLikelyNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if ((uVar4 & 0x5f26) == 0 || (uVar4 & 0xa011) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6e8,"(IntAndLikelyTagged.IsPrimitive())",
                       "IntAndLikelyTagged.IsPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if ((uVar4 & 0x5f26) == 0 || (uVar4 & 0xa010) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6e9,"(IntAndLikelyTagged.IsLikelyPrimitive())",
                       "IntAndLikelyTagged.IsLikelyPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar7.field_0 & 0xfdbe) != 0x28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6eb,"(GetNumberAndLikelyInt(true).IsLikelyTaggedInt())",
                       "GetNumberAndLikelyInt(true).IsLikelyTaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar7.field_0 & 0xfdf6) == 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6ec,"(!GetNumberAndLikelyInt(true).IsLikelyUntaggedInt())",
                       "!GetNumberAndLikelyInt(true).IsLikelyUntaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar7.field_0 & 0xff37) == 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6ed,"(!GetNumberAndLikelyInt(true).IsInt())",
                       "!GetNumberAndLikelyInt(true).IsInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar7.field_0 & 0xfd36) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6ee,"(GetNumberAndLikelyInt(true).IsLikelyInt())",
                       "GetNumberAndLikelyInt(true).IsLikelyInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar7.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6ef,"(!GetNumberAndLikelyInt(true).IsLikelyFloat())",
                       "!GetNumberAndLikelyInt(true).IsLikelyFloat()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar7.field_0 & 800) == 0 || ((ushort)VVar7.field_0 & 0xfc17) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f0,"(GetNumberAndLikelyInt(true).IsNumber())",
                       "GetNumberAndLikelyInt(true).IsNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar7.field_0 & 800) == 0 || ((ushort)VVar7.field_0 & 0xfc14) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f1,"(GetNumberAndLikelyInt(true).IsLikelyNumber())",
                       "GetNumberAndLikelyInt(true).IsLikelyNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar7.field_0 & 0x5f26) == 0 || ((ushort)VVar7.field_0 & 0xa011) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f2,"(GetNumberAndLikelyInt(true).IsPrimitive())",
                       "GetNumberAndLikelyInt(true).IsPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(true);
  if (((ushort)VVar7.field_0 & 0x5f26) == 0 || ((ushort)VVar7.field_0 & 0xa010) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f3,"(GetNumberAndLikelyInt(true).IsLikelyPrimitive())",
                       "GetNumberAndLikelyInt(true).IsLikelyPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Int|CanBeTaggedValue|Likely);
  VVar7.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar7.field_0 & 0xfdbe) != 0x28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f5,"(TaggedInt.ToLikely().IsLikelyTaggedInt())",
                       "TaggedInt.ToLikely().IsLikelyTaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Int|CanBeTaggedValue|Likely);
  VVar7.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar7.field_0 & 0xfdf6) == 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f6,"(!TaggedInt.ToLikely().IsLikelyUntaggedInt())",
                       "!TaggedInt.ToLikely().IsLikelyUntaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Int|CanBeTaggedValue|Likely);
  VVar7.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar7.field_0 & 0xfd36) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f7,"(TaggedInt.ToLikely().IsLikelyInt())",
                       "TaggedInt.ToLikely().IsLikelyInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Int|CanBeTaggedValue|Likely);
  VVar7.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar7.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f8,"(!TaggedInt.ToLikely().IsLikelyFloat())",
                       "!TaggedInt.ToLikely().IsLikelyFloat()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Int|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 800) == 0 || (uVar4 & 0xfc14) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6f9,"(TaggedInt.ToLikely().IsLikelyNumber())",
                       "TaggedInt.ToLikely().IsLikelyNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Int|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0xa011) == 0 && (uVar4 & 0x5f26) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6fa,"(!TaggedInt.ToLikely().IsPrimitive())",
                       "!TaggedInt.ToLikely().IsPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Int|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0x5f26) == 0 || (uVar4 & 0xa010) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6fb,"(TaggedInt.ToLikely().IsLikelyPrimitive())",
                       "TaggedInt.ToLikely().IsLikelyPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  BVar13 = (ushort)VVar9.field_0 | (CanBeTaggedValue|Likely);
  ValueType((ValueType *)&stack0xffffffffffffffa8,BVar13);
  VVar7.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar7.field_0 & 0xfdbe) != 0x28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6fd,"(IntAndLikelyTagged.ToLikely().IsLikelyTaggedInt())",
                       "IntAndLikelyTagged.ToLikely().IsLikelyTaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,BVar13);
  VVar7.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar7.field_0 & 0xfdf6) == 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6fe,"(!IntAndLikelyTagged.ToLikely().IsLikelyUntaggedInt())",
                       "!IntAndLikelyTagged.ToLikely().IsLikelyUntaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,BVar13);
  VVar7.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar7.field_0 & 0xfd36) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6ff,"(IntAndLikelyTagged.ToLikely().IsLikelyInt())",
                       "IntAndLikelyTagged.ToLikely().IsLikelyInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,BVar13);
  VVar7.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar7.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x700,"(!IntAndLikelyTagged.ToLikely().IsLikelyFloat())",
                       "!IntAndLikelyTagged.ToLikely().IsLikelyFloat()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,BVar13);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 800) == 0 || (uVar4 & 0xfc14) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x701,"(IntAndLikelyTagged.ToLikely().IsLikelyNumber())",
                       "IntAndLikelyTagged.ToLikely().IsLikelyNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,BVar13);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0xa011) == 0 && (uVar4 & 0x5f26) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x702,"(!IntAndLikelyTagged.ToLikely().IsPrimitive())",
                       "!IntAndLikelyTagged.ToLikely().IsPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,BVar13);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0x5f26) == 0 || (uVar4 & 0xa010) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x703,"(IntAndLikelyTagged.ToLikely().IsLikelyPrimitive())",
                       "IntAndLikelyTagged.ToLikely().IsLikelyPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if (((ushort)VVar3.field_0 & 0xfdbe) == 0x28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x705,"(!IntAndLikelyUntagged.IsLikelyTaggedInt())",
                       "!IntAndLikelyUntagged.IsLikelyTaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if (((ushort)VVar3.field_0 & 0xfff7) != 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x706,"(IntAndLikelyUntagged.IsIntAndLikelyUntagged())",
                       "IntAndLikelyUntagged.IsIntAndLikelyUntagged()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if (((ushort)VVar3.field_0 & 0xfdf6) != 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x707,"(IntAndLikelyUntagged.IsLikelyUntaggedInt())",
                       "IntAndLikelyUntagged.IsLikelyUntaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if (((ushort)VVar3.field_0 & 0xff37) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x708,"(IntAndLikelyUntagged.IsInt())","IntAndLikelyUntagged.IsInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if (((ushort)VVar3.field_0 & 0xfd36) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x709,"(IntAndLikelyUntagged.IsLikelyInt())",
                       "IntAndLikelyUntagged.IsLikelyInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if (((ushort)VVar3.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x70a,"(!IntAndLikelyUntagged.IsLikelyFloat())",
                       "!IntAndLikelyUntagged.IsLikelyFloat()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if ((uVar5 & 800) == 0 || (uVar5 & 0xfc17) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x70b,"(IntAndLikelyUntagged.IsNumber())","IntAndLikelyUntagged.IsNumber()")
    ;
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if ((uVar5 & 800) == 0 || (uVar5 & 0xfc14) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x70c,"(IntAndLikelyUntagged.IsLikelyNumber())",
                       "IntAndLikelyUntagged.IsLikelyNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if ((uVar5 & 0x5f26) == 0 || (uVar5 & 0xa011) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x70d,"(IntAndLikelyUntagged.IsPrimitive())",
                       "IntAndLikelyUntagged.IsPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if ((uVar5 & 0x5f26) == 0 || (uVar5 & 0xa010) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x70e,"(IntAndLikelyUntagged.IsLikelyPrimitive())",
                       "IntAndLikelyUntagged.IsLikelyPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar7.field_0 & 0xfdbe) == 0x28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x710,"(!GetNumberAndLikelyInt(false).IsLikelyTaggedInt())",
                       "!GetNumberAndLikelyInt(false).IsLikelyTaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar7.field_0 & 0xfff7) == 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x711,"(!GetNumberAndLikelyInt(false).IsIntAndLikelyUntagged())",
                       "!GetNumberAndLikelyInt(false).IsIntAndLikelyUntagged()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar7.field_0 & 0xfdf6) != 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x712,"(GetNumberAndLikelyInt(false).IsLikelyUntaggedInt())",
                       "GetNumberAndLikelyInt(false).IsLikelyUntaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar7.field_0 & 0xff37) == 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x713,"(!GetNumberAndLikelyInt(false).IsInt())",
                       "!GetNumberAndLikelyInt(false).IsInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar7.field_0 & 0xfd36) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x714,"(GetNumberAndLikelyInt(false).IsLikelyInt())",
                       "GetNumberAndLikelyInt(false).IsLikelyInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar7.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x715,"(!GetNumberAndLikelyInt(false).IsLikelyFloat())",
                       "!GetNumberAndLikelyInt(false).IsLikelyFloat()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar7.field_0 & 800) == 0 || ((ushort)VVar7.field_0 & 0xfc17) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x716,"(GetNumberAndLikelyInt(false).IsNumber())",
                       "GetNumberAndLikelyInt(false).IsNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar7.field_0 & 800) == 0 || ((ushort)VVar7.field_0 & 0xfc14) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x717,"(GetNumberAndLikelyInt(false).IsLikelyNumber())",
                       "GetNumberAndLikelyInt(false).IsLikelyNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar7.field_0 & 0x5f26) == 0 || ((ushort)VVar7.field_0 & 0xa011) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x718,"(GetNumberAndLikelyInt(false).IsPrimitive())",
                       "GetNumberAndLikelyInt(false).IsPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  VVar7 = GetNumberAndLikelyInt(false);
  if (((ushort)VVar7.field_0 & 0x5f26) == 0 || ((ushort)VVar7.field_0 & 0xa010) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x719,"(GetNumberAndLikelyInt(false).IsLikelyPrimitive())",
                       "GetNumberAndLikelyInt(false).IsLikelyPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  bits = (ushort)VVar3.field_0 | (CanBeTaggedValue|Likely);
  ValueType((ValueType *)&stack0xffffffffffffffa8,bits);
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar3.field_0 & 0xfdbe) == 0x28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x71b,"(!IntAndLikelyUntagged.ToLikely().IsLikelyTaggedInt())",
                       "!IntAndLikelyUntagged.ToLikely().IsLikelyTaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,bits);
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar3.field_0 & 0xfdf6) != 0xe0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x71c,"(IntAndLikelyUntagged.ToLikely().IsLikelyUntaggedInt())",
                       "IntAndLikelyUntagged.ToLikely().IsLikelyUntaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,bits);
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar3.field_0 & 0xfd36) != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x71d,"(IntAndLikelyUntagged.ToLikely().IsLikelyInt())",
                       "IntAndLikelyUntagged.ToLikely().IsLikelyInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,bits);
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar3.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x71e,"(!IntAndLikelyUntagged.ToLikely().IsLikelyFloat())",
                       "!IntAndLikelyUntagged.ToLikely().IsLikelyFloat()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,bits);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 800) == 0 || (uVar4 & 0xfc14) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x71f,"(IntAndLikelyUntagged.ToLikely().IsLikelyNumber())",
                       "IntAndLikelyUntagged.ToLikely().IsLikelyNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,bits);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0xa011) == 0 && (uVar4 & 0x5f26) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x720,"(!IntAndLikelyUntagged.ToLikely().IsPrimitive())",
                       "!IntAndLikelyUntagged.ToLikely().IsPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,bits);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0x5f26) == 0 || (uVar4 & 0xa010) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x721,"(IntAndLikelyUntagged.ToLikely().IsLikelyPrimitive())",
                       "IntAndLikelyUntagged.ToLikely().IsLikelyPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Float|CanBeTaggedValue|Likely);
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar3.field_0 & 0xfd36) == 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x72b,"(!Float.ToLikely().IsLikelyInt())","!Float.ToLikely().IsLikelyInt()")
    ;
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Float|CanBeTaggedValue|Likely);
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar3.field_0 & 0xfd14) != 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x72c,"(Float.ToLikely().IsLikelyFloat())",
                       "Float.ToLikely().IsLikelyFloat()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Float|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 800) == 0 || (uVar4 & 0xfc14) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x72d,"(Float.ToLikely().IsLikelyNumber())",
                       "Float.ToLikely().IsLikelyNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Float|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0xa011) == 0 && (uVar4 & 0x5f26) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x72e,"(!Float.ToLikely().IsPrimitive())","!Float.ToLikely().IsPrimitive()")
    ;
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Float|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0xa011) == 0 && (uVar4 & 0x5f26) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x72f,"(!Float.ToLikely().IsPrimitive())","!Float.ToLikely().IsPrimitive()")
    ;
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Float|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0x5f26) == 0 || (uVar4 & 0xa010) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x730,"(Float.ToLikely().IsLikelyPrimitive())",
                       "Float.ToLikely().IsLikelyPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Number|CanBeTaggedValue|Likely);
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar3.field_0 & 0xfd36) == 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x73a,"(!Number.ToLikely().IsLikelyInt())",
                       "!Number.ToLikely().IsLikelyInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Number|CanBeTaggedValue|Likely);
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar3.field_0 & 0xfd14) == 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x73b,"(!Number.ToLikely().IsLikelyFloat())",
                       "!Number.ToLikely().IsLikelyFloat()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Number|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 800) == 0 || (uVar4 & 0xfc14) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x73c,"(Number.ToLikely().IsLikelyNumber())",
                       "Number.ToLikely().IsLikelyNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Number|CanBeTaggedValue|Likely);
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar3.field_0 & 0xfff4) != 0x200) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x73d,"(Number.ToLikely().IsLikelyUnknownNumber())",
                       "Number.ToLikely().IsLikelyUnknownNumber()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Number|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0xa011) == 0 && (uVar4 & 0x5f26) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x73e,"(!Number.ToLikely().IsPrimitive())",
                       "!Number.ToLikely().IsPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Number|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0x5f26) == 0 || (uVar4 & 0xa010) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x73f,"(Number.ToLikely().IsLikelyPrimitive())",
                       "Number.ToLikely().IsLikelyPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Object|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0xa010) == 0 && (uVar4 & 0x5f26) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x745,"(!UninitializedObject.ToLikely().IsLikelyPrimitive())",
                       "!UninitializedObject.ToLikely().IsLikelyPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Object|CanBeTaggedValue|Likely);
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if (((ushort)VVar3.field_0 & 0x17) == 0x10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x746,"(!UninitializedObject.ToLikely().IsObject())",
                       "!UninitializedObject.ToLikely().IsObject()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Object|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x747,"(UninitializedObject.ToLikely().IsLikelyObject())",
                       "UninitializedObject.ToLikely().IsLikelyObject()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,CanBeTaggedValue|Undefined|Likely);
  uVar4 = _aStack_58;
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0x339) == 0 || ((ushort)VVar3.field_0 & 0x11) == 0x10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x74a,"(!Undefined.ToLikely().IsNotInt())",
                       "!Undefined.ToLikely().IsNotInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,CanBeTaggedValue|Null|Likely);
  uVar4 = _aStack_58;
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0x339) == 0 || ((ushort)VVar3.field_0 & 0x11) == 0x10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x74c,"(!Null.ToLikely().IsNotInt())","!Null.ToLikely().IsNotInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Boolean|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0x339) == 0 || ((ushort)VVar3.field_0 & 0x11) == 0x10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x74e,"(!Boolean.ToLikely().IsNotInt())","!Boolean.ToLikely().IsNotInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,String|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0x339) == 0 || ((ushort)VVar3.field_0 & 0x11) == 0x10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x750,"(!String.ToLikely().IsNotInt())","!String.ToLikely().IsNotInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  ValueType((ValueType *)&stack0xffffffffffffffa8,Object|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  VVar3.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  if ((uVar4 & 0x339) == 0 || ((ushort)VVar3.field_0 & 0x11) == 0x10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x752,"(!UninitializedObject.ToLikely().IsNotInt())",
                       "!UninitializedObject.ToLikely().IsNotInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  aVar2 = local_34;
  Verify((ValueType)local_34.field_0);
  aVar8.bits = Null;
  if (aVar2.bits != Null) {
    ValueType((ValueType *)&stack0xffffffffffffffa8,aVar2.bits | Null);
    aVar8.bits = aStack_58.bits;
    if ((_aStack_58 & 0x10) == 0) {
      Verify((ValueType)aStack_58.field_0);
    }
    else {
      aVar8.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           MergeWithObject((ValueType *)&local_34.field_0,(ValueType)0x4);
    }
  }
  _aStack_58 = CONCAT62(uStack_56,aVar8.bits);
  if ((aVar8.bits & (Simd|Symbol|String|Boolean|Number|Float|Int|Null|Undefined)) == 0 ||
      (aVar8.bits &
      ~(Simd|Symbol|String|Boolean|Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|
        CanBeTaggedValue|Null|Undefined)) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x756,"(m.IsPrimitive())","m.IsPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if ((aVar8.bits & (Simd|Symbol|String|Boolean|Number|Float|Int|Null|Undefined)) == 0 ||
      (aVar8.bits &
      ~(Simd|Symbol|String|Boolean|Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|
        CanBeTaggedValue|Null|Undefined|Likely)) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x757,"(m.IsLikelyPrimitive())","m.IsLikelyPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  bVar6 = IsSubsetOf((ValueType *)&local_34.field_0,(ValueType)aVar8.field_0,true,true,true,true);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x758,"(IntAndLikelyUntagged.IsSubsetOf(m, true, true, true, true))",
                       "IntAndLikelyUntagged.IsSubsetOf(m, true, true, true, true)");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  bVar6 = IsSubsetOf((ValueType *)&stack0xffffffffffffffa8,(ValueType)aVar2.field_0,true,true,true,
                     true);
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x759,"(!m.IsSubsetOf(IntAndLikelyUntagged, true, true, true, true))",
                       "!m.IsSubsetOf(IntAndLikelyUntagged, true, true, true, true)");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  Verify((ValueType)aVar2.field_0);
  Verify((ValueType)0x10);
  aVar8.bits = Object;
  if (aVar2.bits == Object) {
LAB_00b102be:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x75e,"(m.HasBeenInt())","m.HasBeenInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  else {
    ValueType((ValueType *)&stack0xffffffffffffffa8,aVar2.bits | Object);
    aVar8.bits = aStack_58.bits;
    if ((_aStack_58 & 0x10) == 0) {
      Verify((ValueType)aStack_58.field_0);
    }
    else {
      aVar8.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           MergeWithObject((ValueType *)&local_34.field_0,(ValueType)0x10);
    }
    if ((aVar8.bits & (Int|Object)) != Int) goto LAB_00b102be;
  }
  if ((aVar8.bits &
      ~(Simd|Symbol|String|Boolean|Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|
        CanBeTaggedValue|Null|Undefined|Likely)) == 0 &&
      (aVar8.bits & (Simd|Symbol|String|Boolean|Number|Float|Int|Null|Undefined)) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x75f,"(!m.IsLikelyPrimitive())","!m.IsLikelyPrimitive()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if ((aVar8.bits & (PrimitiveOrObject|Object)) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x760,"(m.HasBeenObject())","m.HasBeenObject()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  if ((aVar8.bits & Object) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x761,"(!m.IsLikelyObject())","!m.IsLikelyObject()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  Verify(VVar9);
  if (VVar9.field_0 == (CanBeTaggedValue|Likely)) {
LAB_00b10552:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x768,"(m.IsLikelyTaggedInt())","m.IsLikelyTaggedInt()");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  else {
    ValueType((ValueType *)&stack0xffffffffffffffa8,BVar13);
    aVar8.bits = aStack_58.bits;
    if ((_aStack_58 & 0x10) == 0) {
      Verify((ValueType)aStack_58.field_0);
    }
    else {
      aVar8.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           MergeWithObject(&Uninitialized,VVar9);
    }
    if ((aVar8.bits &
        ~(Simd|Symbol|String|Boolean|Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|
          CanBeTaggedValue|Null|Undefined)) == 0 &&
        (aVar8.bits & (Simd|Symbol|String|Boolean|Number|Float|Int|Null|Undefined)) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x766,"(!m.IsPrimitive())","!m.IsPrimitive()");
      if (!bVar6) goto LAB_00b10cd8;
      *puVar10 = 0;
    }
    if ((aVar8.bits & Likely) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x767,"(!m.IsDefinite())","!m.IsDefinite()");
      if (!bVar6) goto LAB_00b10cd8;
      *puVar10 = 0;
    }
    if ((aVar8.bits & ~(Number|IntCanBeUntagged|Likely)) != (Int|CanBeTaggedValue))
    goto LAB_00b10552;
  }
  Verify((ValueType)0x10);
  ValueType((ValueType *)&stack0xffffffffffffffa8,Object|Null);
  aVar8.bits = aStack_58.bits;
  if ((_aStack_58 & 0x10) == 0) {
    Verify((ValueType)aStack_58.field_0);
  }
  else {
    aVar8.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         MergeWithObject(&UninitializedObject,(ValueType)0x4);
  }
  local_32[0] = aVar8;
  bVar6 = IsSubsetOf(&UninitializedObject,(ValueType)aVar8.field_0,true,true,true,true);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x76d,"(UninitializedObject.IsSubsetOf(m, true, true, true, true))",
                       "UninitializedObject.IsSubsetOf(m, true, true, true, true)");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  bVar6 = IsSubsetOf((ValueType *)&local_32[0].field_0,(ValueType)0x10,true,true,true,true);
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x76e,"(!m.IsSubsetOf(UninitializedObject, true, true, true, true))",
                       "!m.IsSubsetOf(UninitializedObject, true, true, true, true)");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  bVar6 = IsSubsetOf(&Null,(ValueType)aVar8.field_0,true,true,true,true);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x76f,"(Null.IsSubsetOf(m, true, true, true, true))",
                       "Null.IsSubsetOf(m, true, true, true, true)");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  bVar6 = IsSubsetOf((ValueType *)&local_32[0].field_0,(ValueType)0x4,true,true,true,true);
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x770,"(!m.IsSubsetOf(Null, true, true, true, true))",
                       "!m.IsSubsetOf(Null, true, true, true, true)");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  bVar6 = IsSubsetOf((ValueType *)&local_5a.field_0,(ValueType)aVar8.field_0,true,true,true,true);
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x771,"(!TaggedInt.IsSubsetOf(m, true, true, true, true))",
                       "!TaggedInt.IsSubsetOf(m, true, true, true, true)");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  aVar2 = local_5a;
  bVar6 = IsSubsetOf((ValueType *)&local_32[0].field_0,(ValueType)local_5a.field_0,true,true,true,
                     true);
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x772,"(!m.IsSubsetOf(TaggedInt, true, true, true, true))",
                       "!m.IsSubsetOf(TaggedInt, true, true, true, true)");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  Verify((ValueType)aVar8.field_0);
  Verify((ValueType)aVar2.field_0);
  other = aVar8;
  if (aVar8.bits != aVar2.bits) {
    ValueType((ValueType *)&stack0xffffffffffffffa8,aVar2.bits | aVar8.bits);
    other.bits = aStack_58.bits;
    if ((_aStack_58 & 0x10) == 0) {
      Verify((ValueType)aStack_58.field_0);
    }
    else {
      other.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           MergeWithObject((ValueType *)&local_32[0].field_0,aVar2.field_0);
    }
  }
  _aStack_58 = CONCAT62(uStack_56,other.bits);
  bVar6 = IsSubsetOf((ValueType *)&local_32[0].field_0,(ValueType)other.field_0,true,true,true,true)
  ;
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x775,"(m.IsSubsetOf(po, true, true, true, true))",
                       "m.IsSubsetOf(po, true, true, true, true)");
    if (!bVar6) goto LAB_00b10cd8;
    *puVar10 = 0;
  }
  bVar6 = IsSubsetOf((ValueType *)&stack0xffffffffffffffa8,(ValueType)aVar8.field_0,true,true,true,
                     true);
  sVar11 = extraout_RDX;
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x776,"(!po.IsSubsetOf(m, true, true, true, true))",
                       "!po.IsSubsetOf(m, true, true, true, true)");
    if (!bVar6) {
LAB_00b10cd8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar10 = 0;
    sVar11 = extraout_RDX_00;
  }
  lVar15 = 0;
  RunUnitTests::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000009,(ValueType)0x0,sVar11);
  RunUnitTests::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000028,(ValueType)0x1,i);
  ValueType((ValueType *)&stack0xffffffffffffffa8,Int|CanBeTaggedValue|Likely);
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  RunUnitTests::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)(uVar4 & 0xffff),(ValueType)0x2,i_00);
  ValueType((ValueType *)&stack0xffffffffffffffa8,IntCanBeUntagged|Int|CanBeTaggedValue);
  uVar4 = _aStack_58;
  VVar9.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  sVar14 = 3;
  RunUnitTests::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)(uVar4 & 0xffff),(ValueType)0x3,i_01);
  ValueType((ValueType *)&stack0xffffffffffffffa8,(ushort)VVar9.field_0 | (CanBeTaggedValue|Likely))
  ;
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  RunUnitTests::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)(uVar4 & 0xffff),(ValueType)0x4,i_02);
  ValueType((ValueType *)&stack0xffffffffffffffa8,
            IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue);
  uVar4 = _aStack_58;
  VVar9.field_0 = aStack_58;
  Verify((ValueType)aStack_58.field_0);
  RunUnitTests::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)(uVar4 & 0xffff),(ValueType)0x5,i_03);
  ValueType((ValueType *)&stack0xffffffffffffffa8,(ushort)VVar9.field_0 | (CanBeTaggedValue|Likely))
  ;
  uVar4 = _aStack_58;
  Verify((ValueType)aStack_58.field_0);
  RunUnitTests::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)(uVar4 & 0xffff),(ValueType)0x6,i_04);
  _aStack_58 = 0x208010800280009;
  sVar11 = extraout_RDX_01;
  do {
    BVar13 = *(Bits *)((long)&stack0xffffffffffffffa8 + lVar15 * 2);
    this = (anon_class_1_0_00000001 *)(ulong)BVar13;
    if (((anon_class_1_0_00000001 *)&DAT_00000028 < this) ||
       ((0x10000010200U >> ((ulong)this & 0x3f) & 1) == 0)) {
      RunUnitTests::anon_class_1_0_00000001::operator()(this,(ValueType)(sVar14 * 2 + 1),sVar11);
      ValueType((ValueType *)&local_32[0].field_0,BVar13 | (CanBeTaggedValue|Likely));
      aVar8 = local_32[0];
      Verify((ValueType)local_32[0].field_0);
      RunUnitTests::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)(ulong)aVar8.bits,(ValueType)(sVar14 * 2 + 2),i_05);
      sVar11 = extraout_RDX_02;
      sVar14 = sVar14 + 1;
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0xc);
  objectType = UninitializedObject;
  do {
    if ((ushort)(objectType - Int8Array) < 0xfffe) {
      VVar9 = GetObject(objectType);
      RunUnitTests::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)(CONCAT62(extraout_var,VVar9.field_0) & 0xffffffff),
                 (ValueType)(sVar14 * 2 + 1),i_06);
      ValueType((ValueType *)&local_32[0].field_0,(ushort)VVar9.field_0 | (CanBeTaggedValue|Likely))
      ;
      aVar8 = local_32[0];
      Verify((ValueType)local_32[0].field_0);
      RunUnitTests::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)(ulong)aVar8.bits,(ValueType)(sVar14 * 2 + 2),i_07);
      sVar14 = sVar14 + 1;
    }
    else {
      typeId = TypeIds_Array;
      do {
        if (objectType != ObjectWithArray || typeId == TypeIds_Array) {
          aVar8.bits = sVar14 * 2;
          sVar14 = sVar14 + 2;
          noMissingValues = false;
          bVar6 = true;
          do {
            bVar12 = bVar6;
            local_5c.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 GetObject(objectType);
            local_32[0].field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 SetHasNoMissingValues((ValueType *)&local_5c.field_0,noMissingValues);
            VVar9 = SetArrayTypeId((ValueType *)&local_32[0].field_0,typeId);
            RunUnitTests::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       (CONCAT62(extraout_var_00,VVar9.field_0) & 0xffffffff),
                       (ValueType)(aVar8.bits + Likely),i_08);
            ValueType((ValueType *)&local_32[0].field_0,
                      (ushort)VVar9.field_0 | (CanBeTaggedValue|Likely));
            aVar2 = local_32[0];
            Verify((ValueType)local_32[0].field_0);
            RunUnitTests::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)(ulong)aVar2.bits,
                       (ValueType)(aVar8.bits + Undefined),i_09);
            noMissingValues = true;
            bVar6 = false;
            aVar8.bits = aVar8.bits + Undefined;
          } while (bVar12);
        }
        typeId = typeId + TypeIds_Null;
      } while (typeId != TypeIds_ArrayLastWithES5);
    }
    objectType = objectType + Object;
  } while (objectType != Count);
  return;
}

Assistant:

void ValueType::RunUnitTests()
{
    Assert(Uninitialized.bits == (Bits::Likely | Bits::CanBeTaggedValue));
    Assert(!ObjectType::UninitializedObject); // this is assumed in Merge

    const ValueType TaggedInt(GetTaggedInt());
    const ValueType IntAndLikelyTagged(GetInt(true));
    const ValueType IntAndLikelyUntagged(GetInt(false));

    Assert(TaggedInt.IsTaggedInt());
    Assert(TaggedInt.IsIntAndLikelyTagged());
    Assert(TaggedInt.IsLikelyTaggedInt());
    Assert(!TaggedInt.IsLikelyUntaggedInt());
    Assert(TaggedInt.IsInt());
    Assert(TaggedInt.IsLikelyInt());
    Assert(!TaggedInt.IsLikelyFloat());
    Assert(TaggedInt.IsNumber());
    Assert(TaggedInt.IsLikelyNumber());
    Assert(TaggedInt.IsPrimitive());
    Assert(TaggedInt.IsLikelyPrimitive());

    Assert(!IntAndLikelyTagged.IsTaggedInt());
    Assert(IntAndLikelyTagged.IsIntAndLikelyTagged());
    Assert(IntAndLikelyTagged.IsLikelyTaggedInt());
    Assert(!IntAndLikelyTagged.IsLikelyUntaggedInt());
    Assert(IntAndLikelyTagged.IsInt());
    Assert(IntAndLikelyTagged.IsLikelyInt());
    Assert(!IntAndLikelyTagged.IsLikelyFloat());
    Assert(IntAndLikelyTagged.IsNumber());
    Assert(IntAndLikelyTagged.IsLikelyNumber());
    Assert(IntAndLikelyTagged.IsPrimitive());
    Assert(IntAndLikelyTagged.IsLikelyPrimitive());

    Assert(GetNumberAndLikelyInt(true).IsLikelyTaggedInt());
    Assert(!GetNumberAndLikelyInt(true).IsLikelyUntaggedInt());
    Assert(!GetNumberAndLikelyInt(true).IsInt());
    Assert(GetNumberAndLikelyInt(true).IsLikelyInt());
    Assert(!GetNumberAndLikelyInt(true).IsLikelyFloat());
    Assert(GetNumberAndLikelyInt(true).IsNumber());
    Assert(GetNumberAndLikelyInt(true).IsLikelyNumber());
    Assert(GetNumberAndLikelyInt(true).IsPrimitive());
    Assert(GetNumberAndLikelyInt(true).IsLikelyPrimitive());

    Assert(TaggedInt.ToLikely().IsLikelyTaggedInt());
    Assert(!TaggedInt.ToLikely().IsLikelyUntaggedInt());
    Assert(TaggedInt.ToLikely().IsLikelyInt());
    Assert(!TaggedInt.ToLikely().IsLikelyFloat());
    Assert(TaggedInt.ToLikely().IsLikelyNumber());
    Assert(!TaggedInt.ToLikely().IsPrimitive());
    Assert(TaggedInt.ToLikely().IsLikelyPrimitive());

    Assert(IntAndLikelyTagged.ToLikely().IsLikelyTaggedInt());
    Assert(!IntAndLikelyTagged.ToLikely().IsLikelyUntaggedInt());
    Assert(IntAndLikelyTagged.ToLikely().IsLikelyInt());
    Assert(!IntAndLikelyTagged.ToLikely().IsLikelyFloat());
    Assert(IntAndLikelyTagged.ToLikely().IsLikelyNumber());
    Assert(!IntAndLikelyTagged.ToLikely().IsPrimitive());
    Assert(IntAndLikelyTagged.ToLikely().IsLikelyPrimitive());

    Assert(!IntAndLikelyUntagged.IsLikelyTaggedInt());
    Assert(IntAndLikelyUntagged.IsIntAndLikelyUntagged());
    Assert(IntAndLikelyUntagged.IsLikelyUntaggedInt());
    Assert(IntAndLikelyUntagged.IsInt());
    Assert(IntAndLikelyUntagged.IsLikelyInt());
    Assert(!IntAndLikelyUntagged.IsLikelyFloat());
    Assert(IntAndLikelyUntagged.IsNumber());
    Assert(IntAndLikelyUntagged.IsLikelyNumber());
    Assert(IntAndLikelyUntagged.IsPrimitive());
    Assert(IntAndLikelyUntagged.IsLikelyPrimitive());

    Assert(!GetNumberAndLikelyInt(false).IsLikelyTaggedInt());
    Assert(!GetNumberAndLikelyInt(false).IsIntAndLikelyUntagged());
    Assert(GetNumberAndLikelyInt(false).IsLikelyUntaggedInt());
    Assert(!GetNumberAndLikelyInt(false).IsInt());
    Assert(GetNumberAndLikelyInt(false).IsLikelyInt());
    Assert(!GetNumberAndLikelyInt(false).IsLikelyFloat());
    Assert(GetNumberAndLikelyInt(false).IsNumber());
    Assert(GetNumberAndLikelyInt(false).IsLikelyNumber());
    Assert(GetNumberAndLikelyInt(false).IsPrimitive());
    Assert(GetNumberAndLikelyInt(false).IsLikelyPrimitive());

    Assert(!IntAndLikelyUntagged.ToLikely().IsLikelyTaggedInt());
    Assert(IntAndLikelyUntagged.ToLikely().IsLikelyUntaggedInt());
    Assert(IntAndLikelyUntagged.ToLikely().IsLikelyInt());
    Assert(!IntAndLikelyUntagged.ToLikely().IsLikelyFloat());
    Assert(IntAndLikelyUntagged.ToLikely().IsLikelyNumber());
    Assert(!IntAndLikelyUntagged.ToLikely().IsPrimitive());
    Assert(IntAndLikelyUntagged.ToLikely().IsLikelyPrimitive());

    Assert(!Float.IsLikelyInt());
    Assert(Float.IsFloat());
    Assert(Float.IsLikelyFloat());
    Assert(Float.IsNumber());
    Assert(Float.IsLikelyNumber());
    Assert(Float.IsPrimitive());
    Assert(Float.IsLikelyPrimitive());

    Assert(!Float.ToLikely().IsLikelyInt());
    Assert(Float.ToLikely().IsLikelyFloat());
    Assert(Float.ToLikely().IsLikelyNumber());
    Assert(!Float.ToLikely().IsPrimitive());
    Assert(!Float.ToLikely().IsPrimitive());
    Assert(Float.ToLikely().IsLikelyPrimitive());

    Assert(!Number.IsLikelyInt());
    Assert(!Number.IsLikelyFloat());
    Assert(Number.IsNumber());
    Assert(Number.IsUnknownNumber());
    Assert(Number.IsLikelyNumber());
    Assert(Number.IsPrimitive());
    Assert(Number.IsLikelyPrimitive());

    Assert(!Number.ToLikely().IsLikelyInt());
    Assert(!Number.ToLikely().IsLikelyFloat());
    Assert(Number.ToLikely().IsLikelyNumber());
    Assert(Number.ToLikely().IsLikelyUnknownNumber());
    Assert(!Number.ToLikely().IsPrimitive());
    Assert(Number.ToLikely().IsLikelyPrimitive());

    Assert(!UninitializedObject.IsLikelyPrimitive());
    Assert(UninitializedObject.IsObject());
    Assert(UninitializedObject.IsLikelyObject());

    Assert(!UninitializedObject.ToLikely().IsLikelyPrimitive());
    Assert(!UninitializedObject.ToLikely().IsObject());
    Assert(UninitializedObject.ToLikely().IsLikelyObject());

    Assert(Undefined.IsNotInt());
    Assert(!Undefined.ToLikely().IsNotInt());
    Assert(Null.IsNotInt());
    Assert(!Null.ToLikely().IsNotInt());
    Assert(Boolean.IsNotInt());
    Assert(!Boolean.ToLikely().IsNotInt());
    Assert(String.IsNotInt());
    Assert(!String.ToLikely().IsNotInt());
    Assert(UninitializedObject.IsNotInt());
    Assert(!UninitializedObject.ToLikely().IsNotInt());

    {
        const ValueType m(IntAndLikelyUntagged.Merge(Null));
        Assert(m.IsPrimitive());
        Assert(m.IsLikelyPrimitive());
        Assert(IntAndLikelyUntagged.IsSubsetOf(m, true, true, true, true));
        Assert(!m.IsSubsetOf(IntAndLikelyUntagged, true, true, true, true));
    }

    {
        const ValueType m(IntAndLikelyUntagged.Merge(UninitializedObject));
        Assert(m.HasBeenInt());
        Assert(!m.IsLikelyPrimitive());
        Assert(m.HasBeenObject());
        Assert(!m.IsLikelyObject());
    }

    {
        const ValueType m(Uninitialized.Merge(IntAndLikelyTagged));
        Assert(!m.IsPrimitive());
        Assert(!m.IsDefinite());
        Assert(m.IsLikelyTaggedInt());
    }

    {
        const ValueType m(UninitializedObject.Merge(Null));
        Assert(UninitializedObject.IsSubsetOf(m, true, true, true, true));
        Assert(!m.IsSubsetOf(UninitializedObject, true, true, true, true));
        Assert(Null.IsSubsetOf(m, true, true, true, true));
        Assert(!m.IsSubsetOf(Null, true, true, true, true));
        Assert(!TaggedInt.IsSubsetOf(m, true, true, true, true));
        Assert(!m.IsSubsetOf(TaggedInt, true, true, true, true));

        const ValueType po = m.Merge(TaggedInt);
        Assert(m.IsSubsetOf(po, true, true, true, true));
        Assert(!po.IsSubsetOf(m, true, true, true, true));
    }

    MapInitialValueTypesUntil([](const ValueType valueType0, const size_t i) -> bool
    {
        MapInitialValueTypesUntil([=](const ValueType t1, const size_t j) -> bool
        {
            if(j < i)
                return false;

            const ValueType t0(valueType0);
            const ValueType m(t0.Merge(t1));

            Assert(m.bits == t1.Merge(t0).bits);

            Assert(m.IsUninitialized() == (t0.IsUninitialized() && t1.IsUninitialized()));
            const bool isSubsetWithTypeSpecEnabled = t0.IsSubsetOf(t1, true, true, true, true);
            if(t0.IsUninitialized())
            {
                Assert(isSubsetWithTypeSpecEnabled == t1.IsUninitialized());
                return false;
            }
            else if(t1.IsUninitialized())
            {
                Assert(isSubsetWithTypeSpecEnabled);
                return false;
            }

            Assert(m.IsIntAndLikelyTagged() == (t0.IsIntAndLikelyTagged() && t1.IsIntAndLikelyTagged()));
            Assert(
                m.IsLikelyTaggedInt() ==
                (
                    t0.IsLikelyNumber() && t1.IsLikelyNumber() &&               // both are likely number
                    !t0.IsLikelyFloat() && !t1.IsLikelyFloat() &&               // neither is likely float
                    !t0.IsLikelyUntaggedInt() && !t1.IsLikelyUntaggedInt() &&   // neither is likely untagged int
                    (t0.IsLikelyTaggedInt() || t1.IsLikelyTaggedInt())          // one is likely tagged int
                ));

            Assert(m.IsInt() == (t0.IsInt() && t1.IsInt()));
            Assert(
                m.IsLikelyInt() ==
                (
                    t0.IsLikelyNumber() && t1.IsLikelyNumber() &&   // both are likely number
                    !t0.IsLikelyFloat() && !t1.IsLikelyFloat() &&   // neither is likely float
                    (t0.IsLikelyInt() || t1.IsLikelyInt())          // one is likely int
                ));

            if(!(
                    t0.IsObject() && t1.IsObject() &&                                                             // both are objects
                    (
                        (
                            (
                                t0.GetObjectType() == ObjectType::UninitializedObject ||
                                t1.GetObjectType() == ObjectType::UninitializedObject
                            ) &&                                                                                  // one has an uninitialized object type
                            (t0.GetObjectType() > ObjectType::Object || t1.GetObjectType() > ObjectType::Object)  // one has a specific object type
                        ) ||
                        (t0.IsArrayOrObjectWithArray() || t1.IsArrayOrObjectWithArray()) // or one was an array or an object with array
                    )
                ))                                                                                                // then the resulting object type is not guaranteed
            {
                Assert(m.IsNotInt() == (t0.IsNotInt() && t1.IsNotInt()));
            }

            Assert(m.IsFloat() == (t0.IsNumber() && t1.IsNumber() && (t0.IsFloat() || t1.IsFloat())));
            Assert(
                m.IsLikelyFloat() ==
                (
                    (t0.IsLikelyFloat() || t1.IsLikelyFloat()) &&       // one is likely float
                    (t0.IsLikelyUndefined() || t0.IsLikelyNumber()) &&
                    (t1.IsLikelyUndefined() || t1.IsLikelyNumber())     // both are likely undefined or number
                ));

            Assert(m.IsNumber() == (t0.IsNumber() && t1.IsNumber()));
            Assert(
                m.IsLikelyNumber() ==
                (
                    (t0.IsLikelyNumber() || t1.IsLikelyNumber()) &&     // one is likely number
                    (t0.IsLikelyUndefined() || t0.IsLikelyNumber()) &&
                    (t1.IsLikelyUndefined() || t1.IsLikelyNumber())     // both are likely undefined or number
                ));

            Assert(m.IsUnknownNumber() == (m.IsNumber() && !m.IsLikelyInt() && !m.IsLikelyFloat()));
            Assert(!m.IsLikelyUnknownNumber() || m.IsLikelyNumber() && !m.IsLikelyInt() && !m.IsLikelyFloat());

            Assert(m.IsUndefined() == (t0.IsUndefined() && t1.IsUndefined()));
            Assert(m.IsLikelyUndefined() == (t0.IsLikelyUndefined() && t1.IsLikelyUndefined()));

            Assert(m.IsNull() == (t0.IsNull() && t1.IsNull()));
            Assert(m.IsLikelyNull() == (t0.IsLikelyNull() && t1.IsLikelyNull()));

            Assert(m.IsBoolean() == (t0.IsBoolean() && t1.IsBoolean()));
            Assert(m.IsLikelyBoolean() == (t0.IsLikelyBoolean() && t1.IsLikelyBoolean()));

            Assert(m.IsString() == (t0.IsString() && t1.IsString()));
            Assert(m.IsLikelyString() == (t0.IsLikelyString() && t1.IsLikelyString()));

            if(!(
                    t0.IsObject() && t1.IsObject() &&                                                             // both are objects
                    (
                        (
                            (
                                t0.GetObjectType() == ObjectType::UninitializedObject ||
                                t1.GetObjectType() == ObjectType::UninitializedObject
                            ) &&                                                                                  // one has an uninitialized object type
                            (t0.GetObjectType() > ObjectType::Object || t1.GetObjectType() > ObjectType::Object)  // one has a specific object type
                        ) ||
                        (t0.IsArrayOrObjectWithArray() || t1.IsArrayOrObjectWithArray()) // or one was an array or an object with array
                    )
                ))                                                                                                // then the resulting object type is not guaranteed
            {
                Assert(m.IsObject() == (t0.IsObject() && t1.IsObject()));
            }
            Assert(
                m.IsLikelyObject() ==
                (
                    (t0.IsLikelyObject() || t1.IsLikelyObject()) &&                             // one is likely object
                    (t0.IsLikelyUndefined() || t0.IsLikelyNull() || t0.IsLikelyObject()) &&
                    (t1.IsLikelyUndefined() || t1.IsLikelyNull() || t1.IsLikelyObject())        // both are likely undefined, null, or object
                ));

            if(t1.IsUnknownNumber())
            {
                Assert(isSubsetWithTypeSpecEnabled == (t0.IsNumber() || t0.IsLikelyInt() || t0.IsLikelyFloat()));
                Assert(t0.IsSubsetOf(t1, false, true, true, true) == (t0.IsNumber() || t0.IsLikelyFloat()));
                Assert(t0.IsSubsetOf(t1, true, false, true, true) == (t0.IsNumber() || t0.IsLikelyInt()));
            }
            else if(t0.IsLikelyInt() && t1.IsLikelyInt())
            {
                Assert(
                    isSubsetWithTypeSpecEnabled ==
                    (
                        (t0.IsDefinite() || !t1.IsDefinite()) &&
                        (
                            t0.IsTaggedInt() ||
                            t0.IsLikelyTaggedInt() && !t1.IsTaggedInt() ||
                            !t1.IsLikelyTaggedInt()
                        )
                    ));
            }
            else if(t0.IsLikelyFloat() && t1.IsLikelyFloat())
            {
                Assert(isSubsetWithTypeSpecEnabled == (t0.IsDefinite() || !t1.IsDefinite()));
            }
            else if(t0.IsLikelyNumber() && t1.IsLikelyNumber())
            {
                Assert(
                    isSubsetWithTypeSpecEnabled ==
                    (
                        (t0.IsDefinite() || !t1.IsDefinite()) &&
                        (
                            t0.IsLikelyInt() && !t1.IsLikelyFloat() ||
                            t0.IsLikelyFloat() && !t1.IsLikelyInt() ||
                            t1.IsLikelyUnknownNumber()
                        )
                    ));
            }
            else if(t0.IsLikelyObject() && (t1.IsLikelyUndefined() || t1.IsLikelyNull()))
            {
                Assert(isSubsetWithTypeSpecEnabled);
            }
            else if(t0.IsLikelyObject() && t1.IsLikelyObject())
            {
                if(t1.GetObjectType() == ObjectType::UninitializedObject &&
                    t0.GetObjectType() != ObjectType::UninitializedObject)
                {
                    Assert(isSubsetWithTypeSpecEnabled);
                }
                else if((!t0.IsDefinite() && t1.IsDefinite()) || t0.GetObjectType() != t1.GetObjectType())
                {
                    Assert(!isSubsetWithTypeSpecEnabled);
                }
                else if(
                    (t0.IsDefinite() && !t1.IsDefinite()) ||
                    (t0.GetObjectType() != ObjectType::ObjectWithArray && t0.GetObjectType() != ObjectType::Array))
                {
                    Assert(isSubsetWithTypeSpecEnabled);
                }
                else
                {
                    Assert(
                        isSubsetWithTypeSpecEnabled ==
                        (
                            (t0.HasNoMissingValues() || !t1.HasNoMissingValues()) &&
                            (
                                (!t0.HasNonInts() || t1.HasNonInts()) && (!t0.HasNonFloats() || t1.HasNonFloats())
                            )
                        ));
                    Assert(
                        t0.IsSubsetOf(t1, true, true, false, true) ==
                        (
                            (!t0.HasNonInts() || t1.HasNonInts()) && (!t0.HasNonFloats() || t1.HasNonFloats())
                        ));
                    Assert(t0.IsSubsetOf(t1, true, true, false, false));
                }
            }
            else
            {
                Assert(
                    isSubsetWithTypeSpecEnabled ==
                    (
                        (t0.IsDefinite() || !t1.IsDefinite()) &&
                        !t0.IsLikelyObject() && !t1.IsLikelyObject() &&
                        t1.AllOn(t0.bits)
                    ));
            }

            return false;
        });
        return false;
    });
}